

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O1

int CfdUpdateConfidentialTxOut
              (void *handle,char *tx_hex_string,uint32_t index,char *asset_string,
              int64_t value_satoshi,char *value_commitment,char *address,char *direct_locking_script
              ,char *nonce,char **tx_string)

{
  undefined **ppuVar1;
  Script *pSVar2;
  bool bVar3;
  char *pcVar4;
  CfdException *pCVar5;
  Amount AVar6;
  Script locking_script;
  string addr;
  ConfidentialValue value;
  ConfidentialNonce nonce_obj;
  ConfidentialValue temp_value;
  ConfidentialAssetId asset_obj;
  ElementsAddressFactory address_factory;
  ConfidentialTransactionContext ctx;
  Script local_3c8;
  undefined1 local_390 [16];
  char local_380 [40];
  undefined1 local_358 [40];
  pointer local_330;
  ConfidentialNonce local_310;
  undefined1 local_2e8 [32];
  undefined1 local_2c8 [16];
  pointer local_2b8;
  pointer local_2a0;
  pointer local_288;
  TapBranch local_270;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_1f8;
  Script local_1e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a0 [2];
  ConfidentialAssetId local_138;
  AddressFactory local_110;
  ConfidentialTransactionContext local_e8;
  
  cfd::Initialize();
  bVar3 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar3) {
    local_2e8._0_8_ = "cfdcapi_elements_transaction.cpp";
    local_2e8._8_4_ = 0x140;
    local_2e8._16_8_ = "CfdUpdateConfidentialTxOut";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_2e8,kCfdLogLevelWarning,"tx is null or empty.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_2e8._0_8_ = local_2e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2e8,"Failed to parameter. tx is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_2e8);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (tx_string == (char **)0x0) {
    local_2e8._0_8_ = "cfdcapi_elements_transaction.cpp";
    local_2e8._8_4_ = 0x146;
    local_2e8._16_8_ = "CfdUpdateConfidentialTxOut";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_2e8,kCfdLogLevelWarning,"tx output is null.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_2e8._0_8_ = local_2e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2e8,"Failed to parameter. tx output is null.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_2e8);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar3 = cfd::capi::IsEmptyString(asset_string);
  if (bVar3) {
    local_2e8._0_8_ = "cfdcapi_elements_transaction.cpp";
    local_2e8._8_4_ = 0x14c;
    local_2e8._16_8_ = "CfdUpdateConfidentialTxOut";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_2e8,kCfdLogLevelWarning,"asset is null or empty.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_2e8._0_8_ = local_2e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2e8,"Failed to parameter. asset is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_2e8);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::__cxx11::string::string((string *)local_2e8,tx_hex_string,(allocator *)local_390);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&local_e8,(string *)local_2e8)
  ;
  ppuVar1 = (undefined **)(local_2e8 + 0x10);
  if ((undefined **)local_2e8._0_8_ != ppuVar1) {
    operator_delete((void *)local_2e8._0_8_);
  }
  bVar3 = cfd::ConfidentialTransactionContext::HasBlinding(&local_e8);
  if (bVar3) {
    local_2e8._0_8_ = "cfdcapi_elements_transaction.cpp";
    local_2e8._8_4_ = 0x154;
    local_2e8._16_8_ = "CfdUpdateConfidentialTxOut";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_2e8,kCfdLogLevelWarning,"tx is already blinded.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_2e8._0_8_ = ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2e8,"Failed to blinded. this function can use unblind tx only.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)local_2e8);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)(local_358 + 0x20));
  bVar3 = cfd::capi::IsEmptyString(value_commitment);
  if (bVar3) {
    AVar6 = cfd::core::Amount::CreateBySatoshiAmount(value_satoshi);
    local_390._0_8_ = AVar6.amount_;
    local_390[8] = AVar6.ignore_check_;
    cfd::core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)local_2e8,(Amount *)local_390);
    cfd::core::ConfidentialValue::operator=
              ((ConfidentialValue *)(local_358 + 0x20),(ConfidentialValue *)local_2e8);
  }
  else {
    std::__cxx11::string::string((string *)local_390,value_commitment,(allocator *)&local_3c8);
    cfd::core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)local_2e8,(string *)local_390);
    if ((char *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_);
    }
    bVar3 = cfd::core::ConfidentialValue::HasBlinding((ConfidentialValue *)local_2e8);
    if (!bVar3) {
      cfd::core::ConfidentialValue::operator=
                ((ConfidentialValue *)(local_358 + 0x20),(ConfidentialValue *)local_2e8);
    }
  }
  local_2e8._0_8_ = &PTR__ConfidentialValue_007357f0;
  if ((void *)CONCAT44(local_2e8._12_4_,local_2e8._8_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_2e8._12_4_,local_2e8._8_4_));
  }
  cfd::ElementsAddressFactory::ElementsAddressFactory((ElementsAddressFactory *)&local_110);
  std::__cxx11::string::string((string *)local_2e8,asset_string,(allocator *)local_390);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_138,(string *)local_2e8);
  if ((undefined **)local_2e8._0_8_ != ppuVar1) {
    operator_delete((void *)local_2e8._0_8_);
  }
  cfd::core::ConfidentialNonce::ConfidentialNonce(&local_310);
  bVar3 = cfd::capi::IsEmptyString(nonce);
  if (!bVar3) {
    std::__cxx11::string::string((string *)local_390,nonce,(allocator *)&local_3c8);
    cfd::core::ConfidentialNonce::ConfidentialNonce
              ((ConfidentialNonce *)local_2e8,(string *)local_390);
    cfd::core::ConfidentialNonce::operator=(&local_310,(ConfidentialNonce *)local_2e8);
    local_2e8._0_8_ = &PTR__ConfidentialNonce_007356c0;
    if ((void *)CONCAT44(local_2e8._12_4_,local_2e8._8_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_2e8._12_4_,local_2e8._8_4_));
    }
    if ((char *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_);
    }
  }
  cfd::core::Script::Script((Script *)local_390);
  bVar3 = cfd::capi::IsEmptyString(address);
  if (bVar3) {
    bVar3 = cfd::capi::IsEmptyString(direct_locking_script);
    if (bVar3) goto LAB_003f7883;
    std::__cxx11::string::string((string *)&local_3c8,direct_locking_script,(allocator *)local_358);
    cfd::core::Script::Script((Script *)local_2e8,(string *)&local_3c8);
    cfd::core::Script::operator=((Script *)local_390,(Script *)local_2e8);
    cfd::core::Script::~Script((Script *)local_2e8);
    pSVar2 = &local_3c8;
  }
  else {
    std::__cxx11::string::string((string *)local_358,address,(allocator *)local_2e8);
    bVar3 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress((string *)local_358);
    if (bVar3) {
      cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
                ((ElementsConfidentialAddress *)local_2e8,(string *)local_358);
      cfd::core::ElementsConfidentialAddress::GetLockingScript
                (&local_3c8,(ElementsConfidentialAddress *)local_2e8);
      cfd::core::Script::operator=((Script *)local_390,&local_3c8);
      cfd::core::Script::~Script(&local_3c8);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                ((ElementsConfidentialAddress *)local_2e8);
    }
    else {
      cfd::AddressFactory::GetAddress((Address *)local_2e8,&local_110,(string *)local_358);
      cfd::core::Address::GetLockingScript(&local_3c8,(Address *)local_2e8);
      cfd::core::Script::operator=((Script *)local_390,&local_3c8);
      cfd::core::Script::~Script(&local_3c8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(local_1a0);
      cfd::core::Script::~Script(&local_1e0);
      local_270._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_1f8);
      cfd::core::TapBranch::~TapBranch(&local_270);
      if (local_288 != (pointer)0x0) {
        operator_delete(local_288);
      }
      if (local_2a0 != (pointer)0x0) {
        operator_delete(local_2a0);
      }
      if (local_2b8 != (pointer)0x0) {
        operator_delete(local_2b8);
      }
      if ((undefined1 *)local_2e8._16_8_ != local_2c8) {
        operator_delete((void *)local_2e8._16_8_);
      }
    }
    pSVar2 = (Script *)local_358;
  }
  if (pSVar2->_vptr_Script !=
      (_func_int **)
      ((long)&(pSVar2->script_data_).data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 8U)) {
    operator_delete(pSVar2->_vptr_Script);
  }
LAB_003f7883:
  cfd::core::ByteData::ByteData((ByteData *)local_2e8);
  cfd::core::ByteData::ByteData((ByteData *)&local_3c8);
  cfd::core::ConfidentialTransaction::SetTxOutCommitment
            (&local_e8.super_ConfidentialTransaction,index,&local_138,
             (ConfidentialValue *)(local_358 + 0x20),&local_310,(ByteData *)local_2e8,
             (ByteData *)&local_3c8);
  if (local_3c8._vptr_Script != (_func_int **)0x0) {
    operator_delete(local_3c8._vptr_Script);
  }
  if ((undefined **)local_2e8._0_8_ != (undefined **)0x0) {
    operator_delete((void *)local_2e8._0_8_);
  }
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)local_2e8,(AbstractTransaction *)&local_e8);
  pcVar4 = cfd::capi::CreateString((string *)local_2e8);
  *tx_string = pcVar4;
  if ((undefined **)local_2e8._0_8_ != ppuVar1) {
    operator_delete((void *)local_2e8._0_8_);
  }
  cfd::core::Script::~Script((Script *)local_390);
  local_310._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_007356c0;
  if (local_310.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_310.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_138._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00735710;
  if (local_138.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_110._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_00733578;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_110.prefix_list_);
  local_358._32_8_ = &PTR__ConfidentialValue_007357f0;
  if (local_330 != (pointer)0x0) {
    operator_delete(local_330);
  }
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&local_e8);
  return 0;
}

Assistant:

int CfdUpdateConfidentialTxOut(
    void* handle, const char* tx_hex_string, uint32_t index,
    const char* asset_string, int64_t value_satoshi,
    const char* value_commitment, const char* address,
    const char* direct_locking_script, const char* nonce, char** tx_string) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx output is null.");
    }
    if (IsEmptyString(asset_string)) {
      warn(CFD_LOG_SOURCE, "asset is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. asset is null or empty.");
    }

    ConfidentialTransactionContext ctx(tx_hex_string);
    if (ctx.HasBlinding()) {
      warn(CFD_LOG_SOURCE, "tx is already blinded.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to blinded. this function can use unblind tx only.");
    }

    ConfidentialValue value;
    if (IsEmptyString(value_commitment)) {
      value = ConfidentialValue(Amount::CreateBySatoshiAmount(value_satoshi));
    } else {
      ConfidentialValue temp_value = ConfidentialValue(value_commitment);
      // unconfidential only
      if (!temp_value.HasBlinding()) value = temp_value;
    }

    // add TxOut
    ElementsAddressFactory address_factory;
    ConfidentialAssetId asset_obj(asset_string);
    ConfidentialNonce nonce_obj;
    if (!IsEmptyString(nonce)) {
      nonce_obj = ConfidentialNonce(std::string(nonce));
    }
    Script locking_script;
    if (!IsEmptyString(address)) {
      const std::string addr(address);
      if (ElementsConfidentialAddress::IsConfidentialAddress(addr)) {
        ElementsConfidentialAddress confidential_addr(addr);
        locking_script = confidential_addr.GetLockingScript();
      } else {
        Address unconfidential_addr = address_factory.GetAddress(addr);
        locking_script = unconfidential_addr.GetLockingScript();
      }
    } else if (!IsEmptyString(direct_locking_script)) {
      locking_script = Script(std::string(direct_locking_script));
    }

    ctx.SetTxOutCommitment(
        index, asset_obj, value, nonce_obj, ByteData(), ByteData());
    *tx_string = CreateString(ctx.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}